

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synch_test.c
# Opt level: O3

void test_mutex_lock_unlock(void)

{
  nng_err num;
  int iVar1;
  char *pcVar2;
  nng_mtx *local_20;
  nng_mtx *mtx;
  
  num = nng_mtx_alloc(&local_20);
  pcVar2 = nng_strerror(num);
  iVar1 = acutest_check_((uint)(num == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/synch_test.c"
                         ,0x29,"%s: expected success, got %s (%d)","nng_mtx_alloc(&mtx)",pcVar2,num)
  ;
  if (iVar1 != 0) {
    iVar1 = 99;
    do {
      nng_mtx_lock(local_20);
      nng_mtx_unlock(local_20);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    nng_mtx_free(local_20);
    return;
  }
  acutest_abort_();
}

Assistant:

static void
test_mutex_lock_unlock(void)
{
	nng_mtx *mtx;
	NUTS_PASS(nng_mtx_alloc(&mtx));
	for (int i = 1; i < 100; i++) {
		nng_mtx_lock(mtx);
		nng_mtx_unlock(mtx);
	}
	nng_mtx_free(mtx);
}